

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall
wabt::WastParser::ParseAssertScriptModuleCommand<wabt::AssertModuleCommand<(wabt::CommandType)5>>
          (WastParser *this,TokenType token_type,CommandPtr *out_command)

{
  Command *pCVar1;
  Result RVar2;
  Command *in_RAX;
  Enum EVar3;
  Command *local_28;
  
  RVar2 = Expect(this,Lpar);
  EVar3 = Error;
  if ((RVar2.enum_ != Error) && (RVar2 = Expect(this,token_type), RVar2.enum_ != Error)) {
    MakeUnique<wabt::AssertModuleCommand<(wabt::CommandType)5>>();
    RVar2 = ParseScriptModule(this,(unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>
                                    *)(in_RAX + 1));
    EVar3 = Error;
    local_28 = in_RAX;
    if ((RVar2.enum_ != Error) &&
       ((RVar2 = ParseQuotedText(this,(string *)&in_RAX[1].type), RVar2.enum_ != Error &&
        (RVar2 = Expect(this,Rpar), RVar2.enum_ != Error)))) {
      local_28 = (Command *)0x0;
      pCVar1 = (out_command->_M_t).
               super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
               super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
               super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl;
      (out_command->_M_t).super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
      _M_t.super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
      super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl = in_RAX;
      if (pCVar1 == (Command *)0x0) {
        return (Result)Ok;
      }
      (*pCVar1->_vptr_Command[1])();
      EVar3 = Ok;
    }
    if (local_28 != (Command *)0x0) {
      (*local_28->_vptr_Command[1])();
    }
  }
  return (Result)EVar3;
}

Assistant:

Result WastParser::ParseAssertScriptModuleCommand(TokenType token_type,
                                                  CommandPtr* out_command) {
  WABT_TRACE(ParseAssertScriptModuleCommand);
  EXPECT(Lpar);
  CHECK_RESULT(Expect(token_type));
  auto command = MakeUnique<T>();
  CHECK_RESULT(ParseScriptModule(&command->module));
  CHECK_RESULT(ParseQuotedText(&command->text));
  EXPECT(Rpar);
  *out_command = std::move(command);
  return Result::Ok;
}